

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS ref_collapse_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell_to_collapse [100];
  int local_30;
  REF_INT cell_in_list;
  REF_INT ncell;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  _ncell = ref_grid->cell[8];
  ref_cell._0_4_ = node1;
  ref_cell._4_4_ = node0;
  _node1_local = ref_grid;
  uVar1 = ref_cell_list_with2(_ncell,node0,node1,100,&local_30,&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    for (cell_to_collapse[99] = 0; cell_to_collapse[99] < local_30;
        cell_to_collapse[99] = cell_to_collapse[99] + 1) {
      cell_in_list = (&ref_private_macro_code_rss_1)[cell_to_collapse[99]];
      uVar1 = ref_cell_remove(_ncell,cell_in_list);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x152,"ref_collapse_edge",(ulong)uVar1,"remove");
        return uVar1;
      }
    }
    uVar1 = ref_cell_replace_node(_ncell,(REF_INT)ref_cell,ref_cell._4_4_);
    if (uVar1 == 0) {
      _ncell = _node1_local->cell[3];
      uVar1 = ref_cell_list_with2(_ncell,ref_cell._4_4_,(REF_INT)ref_cell,100,&local_30,
                                  &ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        for (cell_to_collapse[99] = 0; cell_to_collapse[99] < local_30;
            cell_to_collapse[99] = cell_to_collapse[99] + 1) {
          cell_in_list = (&ref_private_macro_code_rss_1)[cell_to_collapse[99]];
          uVar1 = ref_cell_remove(_ncell,cell_in_list);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x15d,"ref_collapse_edge",(ulong)uVar1,"remove");
            return uVar1;
          }
        }
        uVar1 = ref_cell_replace_node(_ncell,(REF_INT)ref_cell,ref_cell._4_4_);
        if (uVar1 == 0) {
          _ncell = _node1_local->cell[0];
          uVar1 = ref_cell_list_with2(_ncell,ref_cell._4_4_,(REF_INT)ref_cell,100,&local_30,
                                      &ref_private_macro_code_rss_1);
          if (uVar1 == 0) {
            for (cell_to_collapse[99] = 0; cell_to_collapse[99] < local_30;
                cell_to_collapse[99] = cell_to_collapse[99] + 1) {
              cell_in_list = (&ref_private_macro_code_rss_1)[cell_to_collapse[99]];
              uVar1 = ref_cell_remove(_ncell,cell_in_list);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x168,"ref_collapse_edge",(ulong)uVar1,"remove");
                return uVar1;
              }
            }
            uVar1 = ref_cell_replace_node(_ncell,(REF_INT)ref_cell,ref_cell._4_4_);
            if (uVar1 == 0) {
              uVar1 = ref_node_remove(_node1_local->node,(REF_INT)ref_cell);
              if (uVar1 == 0) {
                ref_grid_local._4_4_ = ref_geom_remove_all(_node1_local->geom,(REF_INT)ref_cell);
                if (ref_grid_local._4_4_ == 0) {
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                         ,0x16d,"ref_collapse_edge",(ulong)ref_grid_local._4_4_,"rm");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x16c,"ref_collapse_edge",(ulong)uVar1,"rm");
                ref_grid_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x16a,"ref_collapse_edge",(ulong)uVar1,"replace node");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x164,"ref_collapse_edge",(ulong)uVar1,"lst");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x15f,"ref_collapse_edge",(ulong)uVar1,"replace node");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x159,"ref_collapse_edge",(ulong)uVar1,"lst");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x154,"ref_collapse_edge",(ulong)uVar1,"replace node");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           0x14e,"ref_collapse_edge",(ulong)uVar1,"lst");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1)
/*                               keep node0,  remove node1 */
{
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT ncell, cell_in_list;
  REF_INT cell_to_collapse[MAX_CELL_COLLAPSE];

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  RSS(ref_node_remove(ref_grid_node(ref_grid), node1), "rm");
  RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node1), "rm");

  return REF_SUCCESS;
}